

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

Am_Object * __thiscall Am_Object::operator=(Am_Object *this,Am_Object *prev)

{
  uint *puVar1;
  Am_Object_Data *this_00;
  Am_Object_Data *pAVar2;
  
  this_00 = this->data;
  pAVar2 = prev->data;
  this->data = pAVar2;
  if (pAVar2 != (Am_Object_Data *)0x0) {
    puVar1 = &(pAVar2->super_Am_Wrapper).refs;
    *puVar1 = *puVar1 + 1;
  }
  if (this_00 != (Am_Object_Data *)0x0) {
    Am_Wrapper::Release(&this_00->super_Am_Wrapper);
  }
  return this;
}

Assistant:

Am_Object &
Am_Object::operator=(const Am_Object &prev)
{
  Am_Object_Data *old_data = data;
  data = prev.data;
  if (data)
    data->Note_Reference();
  if (old_data)
    old_data->Release();
  return *this;
}